

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int luaD_reallocstack(lua_State *L,int newsize,int raiseerror)

{
  lu_byte lVar1;
  int iVar2;
  StkId pSVar3;
  UpVal *pUVar4;
  CallInfo *pCVar5;
  long lVar6;
  StkId oldstack;
  lu_byte *plVar7;
  int iVar8;
  
  pSVar3 = (L->stack_last).p;
  oldstack = (L->stack).p;
  lVar1 = L->l_G->gcstopem;
  (L->top).p = (StkId)((long)(L->top).p - (long)oldstack);
  (L->tbclist).p = (StkId)((long)(L->tbclist).p - (long)oldstack);
  for (pUVar4 = L->openupval; pUVar4 != (UpVal *)0x0; pUVar4 = (pUVar4->u).open.next) {
    (pUVar4->v).p = (TValue *)((long)(pUVar4->v).p - (L->stack).offset);
  }
  for (pCVar5 = L->ci; pCVar5 != (CallInfo *)0x0; pCVar5 = pCVar5->previous) {
    (pCVar5->top).p = (StkId)((long)(pCVar5->top).p - (L->stack).offset);
    (pCVar5->func).p = (StkId)((long)(pCVar5->func).p - (L->stack).offset);
  }
  L->l_G->gcstopem = '\x01';
  iVar8 = (int)((ulong)((long)pSVar3 - (long)oldstack) >> 4);
  pSVar3 = (StkId)luaM_realloc_(L,oldstack,(long)iVar8 * 0x10 + 0x50,(long)newsize * 0x10 + 0x50);
  L->l_G->gcstopem = lVar1;
  if (pSVar3 == (StkId)0x0) {
    correctstack(L,oldstack);
    iVar2 = 0;
    if (raiseerror != 0) {
      luaD_throw(L,'\x04');
    }
  }
  else {
    (L->stack).p = pSVar3;
    correctstack(L,oldstack);
    (L->stack_last).p = (L->stack).p + newsize;
    iVar2 = 1;
    if (iVar8 < newsize) {
      lVar6 = (long)(iVar8 + 5);
      plVar7 = &(&pSVar3->val)[lVar6].tt_;
      do {
        *plVar7 = '\0';
        lVar6 = lVar6 + 1;
        plVar7 = plVar7 + 0x10;
      } while (lVar6 < newsize + 5);
    }
  }
  return iVar2;
}

Assistant:

int luaD_reallocstack (lua_State *L, int newsize, int raiseerror) {
  int oldsize = stacksize(L);
  int i;
  StkId newstack;
  StkId oldstack = L->stack.p;
  lu_byte oldgcstop = G(L)->gcstopem;
  lua_assert(newsize <= MAXSTACK || newsize == ERRORSTACKSIZE);
  relstack(L);  /* change pointers to offsets */
  G(L)->gcstopem = 1;  /* stop emergency collection */
  newstack = luaM_reallocvector(L, oldstack, oldsize + EXTRA_STACK,
                                   newsize + EXTRA_STACK, StackValue);
  G(L)->gcstopem = oldgcstop;  /* restore emergency collection */
  if (l_unlikely(newstack == NULL)) {  /* reallocation failed? */
    correctstack(L, oldstack);  /* change offsets back to pointers */
    if (raiseerror)
      luaM_error(L);
    else return 0;  /* do not raise an error */
  }
  L->stack.p = newstack;
  correctstack(L, oldstack);  /* change offsets back to pointers */
  L->stack_last.p = L->stack.p + newsize;
  for (i = oldsize + EXTRA_STACK; i < newsize + EXTRA_STACK; i++)
    setnilvalue(s2v(newstack + i)); /* erase new segment */
  return 1;
}